

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O2

bool __thiscall
draco::DecoderBuffer::DecodeLeastSignificantBits32
          (DecoderBuffer *this,uint32_t nbits,uint32_t *out_value)

{
  bool bVar1;
  
  if (this->bit_mode_ == true) {
    bVar1 = BitDecoder::GetBits(&this->bit_decoder_,nbits,out_value);
    return bVar1;
  }
  return false;
}

Assistant:

bool DecodeLeastSignificantBits32(uint32_t nbits, uint32_t *out_value) {
    if (!bit_decoder_active()) {
      return false;
    }
    return bit_decoder_.GetBits(nbits, out_value);
  }